

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Block.cpp
# Opt level: O0

void __thiscall
ninx::parser::element::Block::set_function
          (Block *this,string *name,
          unique_ptr<ninx::parser::element::FunctionDefinition,_std::default_delete<ninx::parser::element::FunctionDefinition>_>
          *func)

{
  mapped_type *this_00;
  unique_ptr<ninx::parser::element::FunctionDefinition,_std::default_delete<ninx::parser::element::FunctionDefinition>_>
  *func_local;
  string *name_local;
  Block *this_local;
  
  this_00 = std::
            unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<ninx::parser::element::FunctionDefinition,_std::default_delete<ninx::parser::element::FunctionDefinition>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<ninx::parser::element::FunctionDefinition,_std::default_delete<ninx::parser::element::FunctionDefinition>_>_>_>_>
            ::operator[](&this->functions,name);
  std::
  unique_ptr<ninx::parser::element::FunctionDefinition,_std::default_delete<ninx::parser::element::FunctionDefinition>_>
  ::operator=(this_00,func);
  return;
}

Assistant:

void ninx::parser::element::Block::set_function(const std::string &name,
                                                std::unique_ptr<ninx::parser::element::FunctionDefinition> func) {
    this->functions[name] = std::move(func);
}